

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aac.cpp
# Opt level: O0

bool __thiscall AACCodec::decodeFrame(AACCodec *this,uint8_t *buffer,uint8_t *end)

{
  bool bVar1;
  byte bVar2;
  uchar uVar3;
  unsigned_short uVar4;
  uint uVar5;
  BitStreamException *e;
  unsigned_short frameSize;
  undefined1 local_48 [8];
  BitStreamReader bits;
  uint8_t *end_local;
  uint8_t *buffer_local;
  AACCodec *this_local;
  
  bits._24_8_ = end;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_48);
  BitStreamReader::setBuffer((BitStreamReader *)local_48,buffer,(uint8_t *)bits._24_8_);
  uVar5 = BitStreamReader::getBits((BitStreamReader *)local_48,0xc);
  if (uVar5 == 0xfff) {
    bVar1 = BitStreamReader::getBit((BitStreamReader *)local_48);
    this->m_id = (uint)bVar1;
    bVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,2);
    this->m_layer = (uint)bVar2;
    BitStreamReader::skipBit((BitStreamReader *)local_48);
    uVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,2);
    this->m_profile = uVar3;
    uVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,4);
    this->m_sample_rates_index = uVar3;
    if (aac_sample_rates[this->m_sample_rates_index] == 0) {
      this_local._7_1_ = false;
    }
    else {
      BitStreamReader::skipBit((BitStreamReader *)local_48);
      uVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,3);
      this->m_channels_index = uVar3;
      if (""[this->m_channels_index] == '\0') {
        this_local._7_1_ = false;
      }
      else {
        BitStreamReader::skipBit((BitStreamReader *)local_48);
        BitStreamReader::skipBit((BitStreamReader *)local_48);
        BitStreamReader::skipBit((BitStreamReader *)local_48);
        BitStreamReader::skipBit((BitStreamReader *)local_48);
        uVar4 = BitStreamReader::getBits<unsigned_short>((BitStreamReader *)local_48,0xd);
        BitStreamReader::skipBits((BitStreamReader *)local_48,0xb);
        uVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,2);
        this->m_rdb = uVar3;
        this->m_channels = ""[this->m_channels_index];
        this->m_sample_rate = aac_sample_rates[this->m_sample_rates_index];
        this->m_samples = (this->m_rdb + 1) * 0x400;
        this->m_bit_rate = (int)((uint)uVar4 * 8 * this->m_sample_rate) / this->m_samples;
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AACCodec::decodeFrame(uint8_t* buffer, const uint8_t* end)
{
    BitStreamReader bits{};
    try
    {
        bits.setBuffer(buffer, end);
        if (bits.getBits(12) != 0xfff)  // sync bytes
            return false;

        m_id = bits.getBit();               /* 0: MPEG-4, 1: MPEG-2*/
        m_layer = bits.getBits<uint8_t>(2); /* layer */
        bits.skipBit();                     /* protection_absent */
        // -- 16 bit
        m_profile = bits.getBits<uint8_t>(2);            /* profile_objecttype */
        m_sample_rates_index = bits.getBits<uint8_t>(4); /* sample_frequency_index */
        if (!aac_sample_rates[m_sample_rates_index])
            return false;
        bits.skipBit();                              /* private_bit */
        m_channels_index = bits.getBits<uint8_t>(3); /* channel_configuration */
        if (!aac_channels[m_channels_index])
            return false;
        bits.skipBit(); /* original/copy */
        bits.skipBit(); /* home */

        /* adts_variable_header */
        bits.skipBit();                                    /* copyright_identification_bit */
        bits.skipBit();                                    /* copyright_identification_start */
        const auto frameSize = bits.getBits<uint16_t>(13); /* aac_frame_length */
        bits.skipBits(11);                                 /* adts_buffer_fullness */
        m_rdb = bits.getBits<uint8_t>(2);                  /* number_of_raw_data_blocks_in_frame */

        m_channels = aac_channels[m_channels_index];
        m_sample_rate = aac_sample_rates[m_sample_rates_index];
        m_samples = (m_rdb + 1) * 1024;
        m_bit_rate = frameSize * 8 * m_sample_rate / m_samples;
        return true;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return false;
    }
}